

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O2

void sq_setdebughook(HSQUIRRELVM v)

{
  SQObjectPtr *pSVar1;
  SQObject o;
  
  pSVar1 = SQVM::GetUp(v,-1);
  o._type = (pSVar1->super_SQObject)._type;
  o._4_4_ = *(undefined4 *)&(pSVar1->super_SQObject).field_0x4;
  o._unVal = (pSVar1->super_SQObject)._unVal;
  if (((o._type == OT_NULL) || (o._type == OT_NATIVECLOSURE)) || (o._type == OT_CLOSURE)) {
    SQObjectPtr::operator=(&v->_debughook_closure,&o);
    v->_debughook_native = (SQDEBUGHOOK)0x0;
    v->_debughook = o._type != OT_NULL;
    SQVM::Pop(v);
  }
  return;
}

Assistant:

void sq_setdebughook(HSQUIRRELVM v)
{
    SQObject o = stack_get(v,-1);
    if(sq_isclosure(o) || sq_isnativeclosure(o) || sq_isnull(o)) {
        v->_debughook_closure = o;
        v->_debughook_native = NULL;
        v->_debughook = !sq_isnull(o);
        v->Pop();
    }
}